

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O3

vector<Range,_std::allocator<Range>_> *
addRanges(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,Range *limits,
         vector<Range,_std::allocator<Range>_> *ranges,
         vector<Range,_std::allocator<Range>_> *additions)

{
  Range *pRVar1;
  iterator iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  Datetime *pDVar6;
  Datetime *pDVar7;
  Range *range;
  Range *pRVar8;
  byte bVar9;
  
  bVar9 = 0;
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar1 = (ranges->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar8 = (ranges->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
                super__Vector_impl_data._M_start; pRVar8 != pRVar1; pRVar8 = pRVar8 + 1) {
    bVar4 = Range::overlaps(limits,pRVar8);
    if (bVar4) {
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Range,std::allocator<Range>>::_M_realloc_insert<Range_const&>
                  ((vector<Range,std::allocator<Range>> *)__return_storage_ptr__,iVar2,pRVar8);
      }
      else {
        (iVar2._M_current)->_vptr_Range = (_func_int **)&PTR__Range_0019f778;
        pDVar6 = &pRVar8->start;
        pDVar7 = &(iVar2._M_current)->start;
        for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
          iVar3 = pDVar6->_month;
          pDVar7->_year = pDVar6->_year;
          pDVar7->_month = iVar3;
          pDVar6 = (Datetime *)((long)pDVar6 + (ulong)bVar9 * -0x10 + 8);
          pDVar7 = (Datetime *)((long)pDVar7 + (ulong)bVar9 * -0x10 + 8);
        }
        (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
  }
  pRVar1 = (additions->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar8 = (additions->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
                super__Vector_impl_data._M_start; pRVar8 != pRVar1; pRVar8 = pRVar8 + 1) {
    bVar4 = Range::overlaps(limits,pRVar8);
    if (bVar4) {
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Range,std::allocator<Range>>::_M_realloc_insert<Range_const&>
                  ((vector<Range,std::allocator<Range>> *)__return_storage_ptr__,iVar2,pRVar8);
      }
      else {
        (iVar2._M_current)->_vptr_Range = (_func_int **)&PTR__Range_0019f778;
        pDVar6 = &pRVar8->start;
        pDVar7 = &(iVar2._M_current)->start;
        for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
          iVar3 = pDVar6->_month;
          pDVar7->_year = pDVar6->_year;
          pDVar7->_month = iVar3;
          pDVar6 = (Datetime *)((long)pDVar6 + (ulong)bVar9 * -0x10 + 8);
          pDVar7 = (Datetime *)((long)pDVar7 + (ulong)bVar9 * -0x10 + 8);
        }
        (__return_storage_ptr__->super__Vector_base<Range,_std::allocator<Range>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Range> addRanges (
  const Range& limits,
  const std::vector <Range>& ranges,
  const std::vector <Range>& additions)
{
  std::vector <Range> results;

  for (auto& range : ranges)
    if (limits.overlaps (range))
      results.push_back (range);

  for (auto& addition : additions)
    if (limits.overlaps (addition))
      results.push_back (addition);

  return results;
}